

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.hh
# Opt level: O1

void __thiscall tinyusdz::GeomPrimvar::GeomPrimvar(GeomPrimvar *this)

{
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  this->_has_value = false;
  Attribute::Attribute(&this->_attr);
  (this->_unauthoredValuesIndex).has_value_ = false;
  (this->_unauthoredValuesIndex).contained = (storage_t<int>)0x0;
  (this->_elementSize).has_value_ = false;
  (this->_elementSize).contained = (storage_t<unsigned_int>)0x0;
  (this->_interpolation).has_value_ = false;
  (this->_interpolation).contained = (storage_t<tinyusdz::Interpolation>)0x0;
  (this->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->_ts_indices)._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_ts_indices)._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_ts_indices)._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_ts_indices)._dirty = false;
  return;
}

Assistant:

GeomPrimvar() : _has_value(false) {
  }